

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool prvTidyParseConfigOption(TidyDocImpl *doc,ctmbstr optnam,ctmbstr optval)

{
  Bool BVar1;
  TidyOptionImpl *pTVar2;
  TidyConfigCallback p_Var3;
  
  pTVar2 = prvTidylookupOption(optnam);
  if (pTVar2 != (TidyOptionImpl *)0x0) {
    BVar1 = prvTidyParseConfigValue(doc,pTVar2->id,optval);
    return BVar1;
  }
  if (doc->pOptCallback == (TidyOptCallback)0x0) {
    p_Var3 = doc->pConfigCallback;
    if (p_Var3 == (TidyConfigCallback)0x0) goto LAB_0013404c;
LAB_00134034:
    BVar1 = (*p_Var3)((TidyDoc)doc,optnam,optval);
    BVar1 = (Bool)(BVar1 != no);
  }
  else {
    BVar1 = (*doc->pOptCallback)(optnam,optval);
    p_Var3 = doc->pConfigCallback;
    if (p_Var3 != (TidyConfigCallback)0x0) {
      if (BVar1 != no) {
        return yes;
      }
      goto LAB_00134034;
    }
  }
  if (BVar1 != no) {
    return BVar1;
  }
LAB_0013404c:
  prvTidyReportUnknownOption(doc,optnam);
  return no;
}

Assistant:

Bool TY_(ParseConfigOption)( TidyDocImpl* doc, ctmbstr optnam, ctmbstr optval )
{
    const TidyOptionImpl* option = TY_(lookupOption)( optnam );
    Bool isDeprecated = isOptionDeprecated( optnam );
    Bool status = ( option != NULL ) && !isDeprecated;
    if ( !status )
    {
        /* Unknown or deprecated, so check to see if the user application
           wants to deal with it first. */
        if (NULL != doc->pOptCallback)
            status = (*doc->pOptCallback)( optnam, optval );
        if (NULL != doc->pConfigCallback )
            status = status || (*doc->pConfigCallback)( tidyImplToDoc(doc), optnam, optval );
        if (!status && isDeprecated)
            status = subDeprecatedOption( doc, optnam, optval);
        if (!status)
            TY_(ReportUnknownOption)( doc, optnam );
    }
    else
        status = TY_(ParseConfigValue)( doc, option->id, optval );

    return status;
}